

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O3

void __thiscall
dg::dda::MemorySSATransformation::findDefinitionsFromCalledFun
          (MemorySSATransformation *this,RWNode *phi,RWSubgraph *subg,DefSite *ds)

{
  long *plVar1;
  RWNodeCall *pRVar2;
  RWBBlock *this_00;
  pointer ppRVar3;
  RWNode *n;
  RWNodeCall *this_01;
  pointer ppRVar4;
  long *plVar5;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> local_48;
  
  plVar5 = *(long **)(subg + 0x18);
  plVar1 = *(long **)(subg + 0x20);
  if (plVar5 != plVar1) {
    do {
      pRVar2 = (RWNodeCall *)*plVar5;
      this_01 = (RWNodeCall *)0x0;
      if ((pRVar2->super_RWNode).type == CALL) {
        this_01 = pRVar2;
      }
      this_00 = (pRVar2->super_RWNode).bblock;
      n = createPhi(this,ds,CALLIN);
      BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>::insertBefore
                (&this_00->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>,n,
                 &this_01->super_RWNode);
      RWNodeCall::addInput(this_01,n);
      RWNode::DefUses::add(&phi->defuse,n);
      findDefinitions(&local_48,this,n,ds);
      ppRVar3 = local_48.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      (n->defuse)._init = true;
      if (local_48.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl
          .super__Vector_impl_data._M_start !=
          local_48.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl
          .super__Vector_impl_data._M_finish) {
        ppRVar4 = local_48.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          RWNode::DefUses::add(&n->defuse,*ppRVar4);
          ppRVar4 = ppRVar4 + 1;
        } while (ppRVar4 != ppRVar3);
      }
      if (local_48.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      plVar5 = plVar5 + 1;
    } while (plVar5 != plVar1);
  }
  return;
}

Assistant:

void MemorySSATransformation::findDefinitionsFromCalledFun(RWNode *phi,
                                                           RWSubgraph *subg,
                                                           const DefSite &ds) {
    for (auto *callsite : subg->getCallers()) {
        auto *C = RWNodeCall::get(callsite);
        assert(C && "Callsite is not a call");

        auto *bblock = callsite->getBBlock();
        assert(bblock && getBBlockInfo(bblock).isCallBlock());

        // create input PHI for this call
        auto *callphi = createPhi(ds, RWNodeType::CALLIN);
        bblock->insertBefore(callphi, C);
        C->addInput(callphi);

        phi->addDefUse(callphi);
        callphi->addDefUse(findDefinitions(callphi, ds));
    }
}